

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O0

void __thiscall QHstsStore::synchronize(QHstsStore *this)

{
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  QHstsStore *in_RDI;
  long in_FS_OFFSET;
  QHstsPolicy *policy;
  add_const_t<QList<QHstsPolicy>_> *__range2;
  QString key;
  const_iterator __end2;
  const_iterator __begin2;
  ComponentFormattingOption in_stack_ffffffffffffff7c;
  QHstsStore *in_stack_ffffffffffffff80;
  QHstsStore *key_00;
  QHstsStore *in_stack_ffffffffffffff98;
  QHstsStore *this_00;
  QHstsStore *key_01;
  QHstsStore *in_stack_ffffffffffffffa8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key_01 = in_RDI;
  bVar1 = isWritable((QHstsStore *)0x28c040);
  if (bVar1) {
    qVar2 = QList<QHstsPolicy>::size(&in_RDI->observedPolicies);
    if (qVar2 != 0) {
      beginHstsGroups(in_stack_ffffffffffffff98);
      local_10.i = (QHstsPolicy *)0xaaaaaaaaaaaaaaaa;
      this_00 = in_RDI;
      local_10 = QList<QHstsPolicy>::begin(&in_stack_ffffffffffffff80->observedPolicies);
      o = QList<QHstsPolicy>::end(&in_stack_ffffffffffffff80->observedPolicies);
      while (bVar1 = QList<QHstsPolicy>::const_iterator::operator!=(&local_10,o), bVar1) {
        in_stack_ffffffffffffff80 =
             (QHstsStore *)QList<QHstsPolicy>::const_iterator::operator*(&local_10);
        key_00 = in_stack_ffffffffffffff80;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff7c);
        QHstsPolicy::host((QHstsPolicy *)in_RDI,
                          (QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
                          SUB84((ulong)this_00 >> 0x20,0));
        host_name_to_settings_key((QString *)this_00);
        QString::~QString((QString *)0x28c15f);
        bVar1 = QHstsPolicy::isExpired((QHstsPolicy *)this_00);
        if ((bVar1) ||
           (bVar1 = serializePolicy(in_stack_ffffffffffffffa8,(QString *)key_01,
                                    (QHstsPolicy *)this_00), !bVar1)) {
          evictPolicy(this_00,(QString *)key_00);
        }
        QString::~QString((QString *)0x28c19e);
        QList<QHstsPolicy>::const_iterator::operator++(&local_10);
      }
      QList<QHstsPolicy>::clear(&in_stack_ffffffffffffff80->observedPolicies);
      endHstsGroups(in_stack_ffffffffffffff80);
    }
    QSettings::sync();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHstsStore::synchronize()
{
    if (!isWritable())
        return;

    if (observedPolicies.size()) {
        beginHstsGroups();
        for (const QHstsPolicy &policy : std::as_const(observedPolicies)) {
            const QString key(host_name_to_settings_key(policy.host()));
            // If we fail to write a new, updated policy, we also remove the old one.
            if (policy.isExpired() || !serializePolicy(key, policy))
                evictPolicy(key);
        }
        observedPolicies.clear();
        endHstsGroups();
    }

    store.sync();
}